

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O2

void capnp::_::
     checkList<capnp::List<short,_(capnp::Kind)0>::Builder,_capnp::List<short,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<short> expected)

{
  uint uVar1;
  ulong uVar2;
  Fault f;
  ListElementCount local_5c;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  ulong local_30;
  
  local_30 = expected._M_len;
  _kjCondition.right = reader.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = reader.builder.elementCount == local_30;
  _kjCondition.left = local_30;
  if (_kjCondition.result) {
    for (uVar1 = 0; uVar2 = (ulong)uVar1, uVar2 < local_30; uVar1 = uVar1 + 1) {
      checkElement<short>(expected._M_array[uVar2],
                          *(short *)(reader.builder.ptr + (uVar2 * reader.builder.step >> 3)));
    }
    return;
  }
  local_5c = reader.builder.elementCount;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())",
             "_kjCondition,expected.size(), reader.size()",&_kjCondition,&local_30,&local_5c);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}